

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regset.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined *local_38;
  OnigEncoding use_encs [1];
  char *end;
  char *s;
  int r;
  int file_exist;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_38 = &OnigEncodingUTF8;
  _r = argv;
  argv_local._0_4_ = argc;
  onig_initialize(&local_38);
  srand(0x3039);
  XX_LEAD = ONIG_REGSET_POSITION_LEAD;
  n(0x19b,0,(char **)0x0," abab bccab ca");
  x2(0x19c,3,p1," abab bccab ca",8,0xb);
  x3(0x19d,3,p1," abab bccab ca",8,0xb,1);
  n(0x19e,3,p2," XXXX AAA 1223 012345678bbb");
  x2(0x19f,3,p2,"0123456789",9,10);
  x2(0x1a0,10,p7,"abcde 555 qwert",6,9);
  x2(0x1a1,2,p8,"",0,0);
  XX_LEAD = ONIG_REGSET_REGEX_LEAD;
  n(0x1a5,0,(char **)0x0," abab bccab ca");
  x2(0x1a6,3,p1," abab bccab ca",8,0xb);
  x3(0x1a7,3,p1," abab bccab ca",8,0xb,1);
  n(0x1a8,3,p2," XXXX AAA 1223 012345678bbb");
  x2(0x1a9,3,p2,"0123456789",9,10);
  x2(0x1aa,10,p7,"abcde 555 qwert",6,9);
  s._0_4_ = get_all_content_of_file("kofu-utf8.txt",&end,(char **)use_encs);
  bVar5 = (int)s != 0;
  if (bVar5) {
    fprintf(_stdout,"Ignore %s\n","kofu-utf8.txt");
  }
  else {
    fprintf(_stdout,"FILE: %s, size: %d\n","kofu-utf8.txt",
            (ulong)(uint)((int)use_encs[0] - (int)end));
  }
  s._4_4_ = (uint)!bVar5;
  if (s._4_4_ != 0) {
    x2(0x1b8,3,p2,end,10,0x16);
    x2(0x1b9,4,p3,end,0x791cf,0x791d8);
    x2(0x1ba,0x10,p4,end,0x50e,0x523);
  }
  __stream = _stdout;
  iVar2 = nerror;
  iVar1 = nfail;
  iVar3 = nsucc;
  uVar4 = onig_version();
  fprintf(__stream,"\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
          (ulong)(uint)iVar3,(ulong)(uint)iVar1,(ulong)(uint)iVar2,uVar4);
  if (s._4_4_ != 0) {
    fprintf(_stdout,"\n");
    time_compare(3,p2,end,(char *)use_encs[0]);
    time_compare(4,p3,end,(char *)use_encs[0]);
    time_compare(0x10,p4,end,(char *)use_encs[0]);
    time_compare(0xe,p5,end,(char *)use_encs[0]);
    time_compare(5,p6,end,(char *)use_encs[0]);
    fprintf(_stdout,"\n");
    free(end);
  }
  onig_end();
  iVar3 = -1;
  if (nfail == 0 && nerror == 0) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

extern int
main(int argc, char* argv[])
{
#ifndef _WIN32
  int file_exist;
#endif
  int r;
  char *s, *end;
  OnigEncoding use_encs[1];

  use_encs[0] = ONIG_ENCODING_UTF8;
  onig_initialize(use_encs, sizeof(use_encs)/sizeof(use_encs[0]));

  srand(12345);

  XX_LEAD = ONIG_REGSET_POSITION_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);
  X2(p8, "", 0, 0);

  XX_LEAD = ONIG_REGSET_REGEX_LEAD;

  NZERO(" abab bccab ca");
  X2(p1, " abab bccab ca", 8, 11);
  X3(p1, " abab bccab ca", 8, 11, 1);
  N(p2, " XXXX AAA 1223 012345678bbb");
  X2(p2, "0123456789", 9, 10);
  X2(p7, "abcde 555 qwert", 6, 9);

#ifndef _WIN32
  r = get_all_content_of_file(TEXT_PATH, &s, &end);
  if (r == 0) {
    fprintf(stdout, "FILE: %s, size: %d\n", TEXT_PATH, (int )(end - s));
    file_exist = 1;
  }
  else {
    fprintf(stdout, "Ignore %s\n", TEXT_PATH);
    file_exist = 0;
  }

  if (file_exist != 0) {
    X2(p2, s, 10, 22);
    X2(p3, s, 496079, 496088);
    X2(p4, s, 1294, 1315);
  }
#endif

  fprintf(stdout,
          "\nRESULT   SUCC: %4d,  FAIL: %d,  ERROR: %d      (by Oniguruma %s)\n",
          nsucc, nfail, nerror, onig_version());

#ifndef _WIN32
  if (file_exist != 0) {
    fprintf(stdout, "\n");
    time_compare(ASIZE(p2), p2, s, end);
    time_compare(ASIZE(p3), p3, s, end);
    time_compare(ASIZE(p4), p4, s, end);
    time_compare(ASIZE(p5), p5, s, end);
    time_compare(ASIZE(p6), p6, s, end);
    fprintf(stdout, "\n");
    free(s);
  }
#endif

  onig_end();

  return ((nfail == 0 && nerror == 0) ? 0 : -1);
}